

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::texStorage2D
          (ReferenceContext *this,deUint32 target,int levels,deUint32 internalFormat,int width,
          int height)

{
  pointer pTVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int level;
  int iVar5;
  Texture2D *pTVar6;
  TextureCube *pTVar7;
  int level_1;
  TextureFormat storageFmt;
  TextureFormat local_40;
  int local_38;
  uint local_34;
  
  iVar5 = this->m_activeTexture;
  pTVar1 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40.order = CHANNELORDER_LAST;
  local_40.type = CHANNELTYPE_LAST;
  if (0 < width && 0 < height) {
    uVar2 = height;
    if (height < width) {
      uVar2 = width;
    }
    uVar3 = 0x20;
    if (uVar2 != 0) {
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    if ((0 < levels) && (levels <= (int)(0x20 - uVar3))) {
      local_40 = mapInternalFormat(internalFormat);
      if ((local_40.order == CHANNELORDER_LAST) || (local_40.type == CHANNELTYPE_LAST)) {
LAB_009a51ab:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      if (target == 0x8513) {
        pTVar7 = &pTVar1[iVar5].defaultCubeTex;
        if (pTVar1[iVar5].texCubeBinding != (TextureCube *)0x0) {
          pTVar7 = pTVar1[iVar5].texCubeBinding;
        }
        iVar5 = (this->m_limits).maxTextureCubeSize;
        if (width <= iVar5 && height <= iVar5) {
          if ((pTVar7->super_Texture).m_immutable != true) {
            lVar4 = 0x60;
            local_38 = levels;
            do {
              rc::TextureLevelArray::clear
                        ((TextureLevelArray *)
                         ((long)(pTVar7->m_levels[0].m_data + 0xfffffffffffffffa) + lVar4));
              lVar4 = lVar4 + 0x540;
            } while (lVar4 != 0x1fe0);
            (pTVar7->super_Texture).m_immutable = true;
            iVar5 = 0;
            local_34 = height;
            do {
              uVar2 = (uint)width >> ((byte)iVar5 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar3 = local_34 >> ((byte)iVar5 & 0x1f);
              if ((int)uVar3 < 2) {
                uVar3 = 1;
              }
              lVar4 = 0x60;
              do {
                rc::TextureLevelArray::allocLevel
                          ((TextureLevelArray *)
                           ((long)(pTVar7->m_levels[0].m_data + 0xfffffffffffffffa) + lVar4),iVar5,
                           &local_40,uVar2,uVar3,1);
                lVar4 = lVar4 + 0x540;
              } while (lVar4 != 0x1fe0);
              iVar5 = iVar5 + 1;
            } while (iVar5 != local_38);
            return;
          }
LAB_009a51ff:
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x502;
          return;
        }
      }
      else {
        if (target != 0xde1) goto LAB_009a51ab;
        pTVar6 = &pTVar1[iVar5].default2DTex;
        if (pTVar1[iVar5].tex2DBinding != (Texture2D *)0x0) {
          pTVar6 = pTVar1[iVar5].tex2DBinding;
        }
        iVar5 = (this->m_limits).maxTexture2DSize;
        if (width <= iVar5 && height < iVar5) {
          if ((pTVar6->super_Texture).m_immutable != true) {
            rc::TextureLevelArray::clear(&pTVar6->m_levels);
            (pTVar6->super_Texture).m_immutable = true;
            iVar5 = 0;
            do {
              uVar2 = (uint)width >> ((byte)iVar5 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar3 = (uint)height >> ((byte)iVar5 & 0x1f);
              if ((int)uVar3 < 2) {
                uVar3 = 1;
              }
              rc::TextureLevelArray::allocLevel(&pTVar6->m_levels,iVar5,&local_40,uVar2,uVar3,1);
              iVar5 = iVar5 + 1;
            } while (levels != iVar5);
            return;
          }
          goto LAB_009a51ff;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texStorage2D (deUint32 target, int levels, deUint32 internalFormat, int width, int height)
{
	TextureUnit&		unit		= m_textureUnits[m_activeTexture];
	TextureFormat		storageFmt;

	RC_IF_ERROR(width <= 0 || height <= 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(!de::inRange(levels, 1, (int)deLog2Floor32(de::max(width, height))+1), GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height >= m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		TextureCube& texture = unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;

		RC_IF_ERROR(width > m_limits.maxTextureCubeSize || height > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				texture.allocFace(level, (tcu::CubeFace)face, storageFmt, levelW, levelH);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}